

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.cpp
# Opt level: O2

size_t __thiscall
TransitionObservationIndependentMADPDiscrete::CreateJointActionsRecursively
          (TransitionObservationIndependentMADPDiscrete *this,Index curAgentI,
          JointActionDiscrete *ja,Index jaI)

{
  size_t sVar1;
  ulong uVar2;
  ActionDiscrete *a;
  JointActionDiscrete *this_00;
  uint a_00;
  ulong uVar3;
  ulong local_80;
  JointActionDiscrete *p_ja;
  JointActionDiscrete *local_70;
  Index local_64;
  TransitionObservationIndependentMADPDiscrete *local_60;
  ulong local_58;
  JointActionDiscrete *local_50;
  vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_> *local_48;
  ulong local_40;
  ulong local_38;
  
  local_80 = (ulong)jaI;
  sVar1 = (this->super_MultiAgentDecisionProcess)._m_nrAgents;
  uVar3 = (ulong)curAgentI;
  uVar2 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x48))();
  local_70 = (JointActionDiscrete *)operator_new(0x48);
  local_50 = ja;
  JointActionDiscrete::JointActionDiscrete(local_70,ja);
  local_40 = uVar2 - 1;
  local_64 = curAgentI + 1;
  local_48 = &this->_m_jointActionVec;
  a_00 = 0;
  local_60 = this;
  local_58 = uVar3;
  local_38 = uVar2;
  while( true ) {
    uVar2 = (ulong)a_00;
    if (local_38 <= uVar2) break;
    a = MADPComponentDiscreteActions::GetActionDiscrete
                  (&(this->_m_individualMADPDs).
                    super__Vector_base<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar3]->_m_A,0,a_00);
    this_00 = local_50;
    if ((uVar2 != 0) && (this_00 = local_70, local_40 != uVar2)) {
      this_00 = (JointActionDiscrete *)operator_new(0x48);
      JointActionDiscrete::JointActionDiscrete(this_00,local_70);
    }
    p_ja = this_00;
    if (sVar1 - 1 == uVar3) {
      (this_00->super_DiscreteEntity)._m_index = (Index)local_80;
      JointActionDiscrete::AddIndividualAction(this_00,a,(Index)local_58);
      std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>::push_back
                (local_48,&p_ja);
      local_80 = (ulong)((Index)local_80 + 1);
      this = local_60;
    }
    else {
      JointActionDiscrete::AddIndividualAction(this_00,a,(Index)local_58);
      this = local_60;
      local_80 = CreateJointActionsRecursively(local_60,local_64,p_ja,(Index)local_80);
    }
    a_00 = a_00 + 1;
  }
  return local_80 & 0xffffffff;
}

Assistant:

size_t TransitionObservationIndependentMADPDiscrete::
CreateJointActionsRecursively(Index curAgentI, JointActionDiscrete& ja, 
        Index jaI)
{
if(DEBUG_CJA)    cerr << "TransitionObservationIndependentMADPDiscrete::CreateJointActions(Index "<<curAgentI<<", JointActionDiscrete& ja, Index "<< jaI<<") called"<<endl;

    bool lastAgent=false;
    if(curAgentI == _m_nrAgents-1)
    {
        lastAgent = true;    
        if(DEBUG_CJA)     cerr << "\nlast agent\n";
    }

    //we are going to walk through this agents action vector
    size_t nrA = GetNrActions(curAgentI);
    
    //first action extends the received ja 
    JointActionDiscrete* p_jaReceivedArgCopy = new JointActionDiscrete(ja);
    JointActionDiscrete* p_ja;
    
    for(Index a=0; a < nrA; a++)
    {
        const ActionDiscrete * adp = GetIndividualMADPD(curAgentI)->
            GetActionDiscrete(0, a);
        if(DEBUG_CJA) cerr << "\nnext action";
//        if(it == first) //
        if(a == 0)      
        {
            if(DEBUG_CJA) cerr << "(first action - not making copy)\n";
            p_ja = &ja;
        }
        else if ( a == nrA-1 )//it == beforelast)
            //this is the last last action   
        {
            if(DEBUG_CJA) cerr << "(last action - not making copy)\n";
            p_ja = p_jaReceivedArgCopy; //don't make a new copy
        }
        else //make a new copy
        {        
            if(DEBUG_CJA) cerr << "(intermed. action - making copy)\n";
            p_ja = new JointActionDiscrete(*p_jaReceivedArgCopy);    
        }    
        if(lastAgent)
        {
            p_ja->SetIndex(jaI);
            if(DEBUG_CJA)cerr << "setting index of this joint action to: "<< 
                jaI <<endl;
        }
//        ActionDiscrete* adp = /*(ActionDiscrete*)*/ &(*it);
        if(DEBUG_CJA)
            cerr <<"Adding agent's indiv. action to joint action..."<<endl;
        p_ja->AddIndividualAction(adp, curAgentI);        
        if(lastAgent) //jointAction is now completed: add it to jointAction set.
        {
            if(DEBUG_CJA){cerr << "INSERTING the joint action:"; 
                p_ja->Print();cerr<<endl;}
            _m_jointActionVec.push_back(p_ja);
            if(DEBUG_CJA){cerr << "\nINSERTED the joint action."<<endl;
                cerr << "_m_jointActionVec now containts "<< 
                _m_jointActionVec.size() << " joint actions." << endl;}
            jaI++;
        }
        else
            jaI = CreateJointActionsRecursively(curAgentI+1,*p_ja, jaI);
        
//        it++;
    }
    if(DEBUG_CJA)    cerr << ">>ProblemDecTiger::CreateJointActionsRecursively(Index "<<curAgentI<<", JointActionDiscrete& ja, Index "<< jaI<<") FINISHED"<<endl;
    return jaI;
}